

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseExtensions
          (Parser *this,DescriptorProto *message,LocationRecorder *extensions_location,
          FileDescriptorProto *containing_file)

{
  Tokenizer *pTVar1;
  DescriptorProto *pDVar2;
  SourceCodeInfo *source_code_info;
  FileDescriptorProto *containing_file_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  Message *descriptor;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar6;
  ExtensionRangeOptions *from;
  ExtensionRangeOptions *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
  *pVVar7;
  SourceCodeInfo_Location *this_01;
  pointer piVar8;
  uint uVar9;
  Arena *pAVar10;
  int iVar11;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  LocationRecorder start_location;
  int start;
  LocationRecorder location;
  Token start_token;
  int local_e4;
  ulong local_e0;
  LocationRecorder *local_d8;
  Message *local_d0;
  LocationRecorder local_c8;
  DescriptorProto *local_b0;
  RepeatedPtrFieldBase *local_a8;
  int local_9c;
  LocationRecorder local_98;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  undefined1 local_70 [24];
  RepeatedPtrFieldBase local_58;
  FileDescriptorProto *local_38;
  
  text._M_str = "extensions";
  text._M_len = 10;
  local_d8 = extensions_location;
  bVar3 = Consume(this,text);
  if (bVar3) {
    local_e0 = (ulong)*(uint *)((long)&message->field_0 + 0x58);
    local_a8 = &(message->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase;
    local_b0 = message;
    local_38 = containing_file;
    do {
      iVar4 = *(int *)((long)&local_b0->field_0 + 0x58);
      LocationRecorder::Init(&local_98,local_d8,local_d8->source_code_info_);
      RepeatedField<int>::Add(&((local_98.location_)->field_0)._impl_.path_,iVar4);
      descriptor = (Message *)
                   internal::RepeatedPtrFieldBase::AddMessageLite
                             (local_a8,Arena::
                                       DefaultConstruct<google::protobuf::DescriptorProto_ExtensionRange>
                             );
      LocationRecorder::RecordLegacyLocation(&local_98,descriptor,NUMBER);
      source_code_info = local_98.source_code_info_;
      local_70._0_8_ = (Arena *)0x0;
      local_70[8] = '\0';
      local_d0 = descriptor;
      local_78._M_p = local_70 + 8;
      LocationRecorder::Init(&local_c8,&local_98,local_98.source_code_info_);
      RepeatedField<int>::Add(&((local_c8.location_)->field_0)._impl_.path_,1);
      pTVar1 = this->input_;
      local_80._0_4_ = (pTVar1->current_).type;
      std::__cxx11::string::_M_assign((string *)&local_78);
      local_58.current_size_ = (pTVar1->current_).end_column;
      local_58.tagged_rep_or_elem_ = *(void **)&(pTVar1->current_).line;
      bVar3 = ConsumeInteger(this,&local_9c,(ErrorMaker)ZEXT816(0x3d7d58));
      iVar4 = local_9c;
      if (!bVar3) {
LAB_001fff3a:
        LocationRecorder::~LocationRecorder(&local_c8);
        if (local_78._M_p != local_70 + 8) {
          operator_delete(local_78._M_p,CONCAT71(local_70._9_7_,local_70[8]) + 1);
        }
        LocationRecorder::~LocationRecorder(&local_98);
        return false;
      }
      if (local_9c == 0x7fffffff) {
        RecordError(this,(ErrorMaker)ZEXT816(0x3d7d75));
        goto LAB_001fff3a;
      }
      LocationRecorder::~LocationRecorder(&local_c8);
      text_00._M_str = "to";
      text_00._M_len = 2;
      bVar3 = TryConsume(this,text_00);
      if (bVar3) {
        LocationRecorder::Init(&local_c8,&local_98,source_code_info);
        RepeatedField<int>::Add(&((local_c8.location_)->field_0)._impl_.path_,2);
        text_01._M_str = "max";
        text_01._M_len = 3;
        bVar3 = TryConsume(this,text_01);
        if (bVar3) {
          local_e4 = -2;
        }
        else {
          bVar3 = ConsumeInteger(this,&local_e4,(ErrorMaker)ZEXT816(0x3d7d95));
          if (!bVar3) goto LAB_001fff3a;
          if (local_e4 == 0x7fffffff) {
            RecordError(this,(ErrorMaker)ZEXT816(0x3d7d75));
            goto LAB_001fff3a;
          }
        }
        iVar5 = local_e4;
        LocationRecorder::~LocationRecorder(&local_c8);
      }
      else {
        LocationRecorder::Init(&local_c8,&local_98,source_code_info);
        RepeatedField<int>::Add(&((local_c8.location_)->field_0)._impl_.path_,2);
        LocationRecorder::StartAt(&local_c8,(Token *)local_80);
        LocationRecorder::EndAt(&local_c8,(Token *)local_80);
        local_e4 = iVar4;
        LocationRecorder::~LocationRecorder(&local_c8);
        iVar5 = iVar4;
      }
      *(int *)&local_d0[2].super_MessageLite._vptr_MessageLite = iVar4;
      *(int *)((long)&local_d0[2].super_MessageLite._vptr_MessageLite + 4) = iVar5 + 1;
      *(byte *)&local_d0[1].super_MessageLite._vptr_MessageLite =
           *(byte *)&local_d0[1].super_MessageLite._vptr_MessageLite | 6;
      if (local_78._M_p != local_70 + 8) {
        operator_delete(local_78._M_p,CONCAT71(local_70._9_7_,local_70[8]) + 1);
      }
      LocationRecorder::~LocationRecorder(&local_98);
      text_02._M_str = ",";
      text_02._M_len = 1;
      bVar3 = TryConsume(this,text_02);
    } while (bVar3);
    if (((this->input_->current_).text._M_string_length != 1) ||
       (*(this->input_->current_).text._M_dataplus._M_p != '[')) {
LAB_0020007d:
      text_06._M_str = ";";
      text_06._M_len = 1;
      bVar3 = ConsumeEndOfDeclaration(this,text_06,local_d8);
      return bVar3;
    }
    iVar4 = internal::SooRep::size
                      (&(local_d8->location_->field_0)._impl_.path_.soo_rep_,
                       (undefined1  [96])
                       ((undefined1  [96])local_d8->location_->field_0 & (undefined1  [96])0x4) ==
                       (undefined1  [96])0x0);
    local_d0 = (Message *)CONCAT44(local_d0._4_4_,iVar4);
    SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)local_80,(Arena *)0x0);
    pVVar6 = internal::RepeatedPtrFieldBase::
             Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                       (local_a8,(int)local_e0);
    containing_file_00 = local_38;
    pDVar2 = local_b0;
    *(byte *)&pVVar6->field_0 = *(byte *)&pVVar6->field_0 | 1;
    from = (pVVar6->field_0)._impl_.options_;
    if (from == (ExtensionRangeOptions *)0x0) {
      pAVar10 = (Arena *)(pVVar6->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar10 & 1) != 0) {
        pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
      }
      from = (ExtensionRangeOptions *)
             Arena::DefaultConstruct<google::protobuf::ExtensionRangeOptions>(pAVar10);
      (pVVar6->field_0)._impl_.options_ = from;
    }
    LocationRecorder::Init(&local_98,local_d8,(SourceCodeInfo *)local_80);
    RepeatedField<int>::Add(&((local_98.location_)->field_0)._impl_.path_,0);
    LocationRecorder::Init(&local_c8,&local_98,local_98.source_code_info_);
    RepeatedField<int>::Add(&((local_c8.location_)->field_0)._impl_.path_,3);
    text_03._M_str = "[";
    text_03._M_len = 1;
    bVar3 = Consume(this,text_03);
    if (bVar3) {
      do {
        bVar3 = ParseOption(this,&from->super_Message,&local_c8,containing_file_00,OPTION_ASSIGNMENT
                           );
        if (!bVar3) goto LAB_001fff9c;
        text_04._M_str = ",";
        text_04._M_len = 1;
        bVar3 = TryConsume(this,text_04);
      } while (bVar3);
      text_05._M_str = "]";
      text_05._M_len = 1;
      bVar3 = Consume(this,text_05);
      LocationRecorder::~LocationRecorder(&local_c8);
      LocationRecorder::~LocationRecorder(&local_98);
      if (bVar3) {
        iVar4 = (int)local_e0;
        while( true ) {
          iVar4 = iVar4 + 1;
          iVar5 = *(int *)((long)&pDVar2->field_0 + 0x58);
          if (iVar5 <= iVar4) break;
          pVVar6 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                             (local_a8,iVar4);
          *(byte *)&pVVar6->field_0 = *(byte *)&pVVar6->field_0 | 1;
          this_00 = (pVVar6->field_0)._impl_.options_;
          if (this_00 == (ExtensionRangeOptions *)0x0) {
            pAVar10 = (Arena *)(pVVar6->super_Message).super_MessageLite._internal_metadata_.ptr_;
            if (((ulong)pAVar10 & 1) != 0) {
              pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
            }
            this_00 = (ExtensionRangeOptions *)
                      Arena::DefaultConstruct<google::protobuf::ExtensionRangeOptions>(pAVar10);
            (pVVar6->field_0)._impl_.options_ = this_00;
          }
          ExtensionRangeOptions::CopyFrom(this_00,from);
        }
        if ((int)local_e0 < iVar5) {
          iVar11 = (int)local_d0 + 1;
          iVar4 = local_58.current_size_;
          do {
            if (0 < iVar4) {
              iVar4 = 0;
              do {
                pVVar7 = internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                                   (&local_58,iVar4);
                iVar5 = internal::SooRep::size
                                  (&(pVVar7->field_0)._impl_.path_.soo_rep_,
                                   (undefined1  [96])
                                   ((undefined1  [96])pVVar7->field_0 & (undefined1  [96])0x4) ==
                                   (undefined1  [96])0x0);
                if (iVar5 != iVar11) {
                  this_01 = (SourceCodeInfo_Location *)
                            internal::RepeatedPtrFieldBase::AddMessageLite
                                      (&(this->source_code_info_->field_0)._impl_.location_.
                                        super_RepeatedPtrFieldBase,
                                       Arena::
                                       DefaultConstruct<google::protobuf::SourceCodeInfo_Location>);
                  pVVar7 = internal::RepeatedPtrFieldBase::
                           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                                     (&local_58,iVar4);
                  SourceCodeInfo_Location::CopyFrom(this_01,pVVar7);
                  piVar8 = RepeatedField<int>::Mutable
                                     (&(this_01->field_0)._impl_.path_,(int)local_d0);
                  *piVar8 = (int)local_e0;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_58.current_size_);
              iVar5 = *(int *)((long)&local_b0->field_0 + 0x58);
              iVar4 = local_58.current_size_;
            }
            uVar9 = (int)local_e0 + 1;
            local_e0 = (ulong)uVar9;
          } while ((int)uVar9 < iVar5);
        }
        SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)local_80);
        goto LAB_0020007d;
      }
    }
    else {
LAB_001fff9c:
      LocationRecorder::~LocationRecorder(&local_c8);
      LocationRecorder::~LocationRecorder(&local_98);
    }
    SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)local_80);
  }
  return false;
}

Assistant:

bool Parser::ParseExtensions(DescriptorProto* message,
                             const LocationRecorder& extensions_location,
                             const FileDescriptorProto* containing_file) {
  // Parse the declaration.
  DO(Consume("extensions"));

  int old_range_size = message->extension_range_size();

  do {
    // Note that kExtensionRangeFieldNumber was already pushed by the parent.
    LocationRecorder location(extensions_location,
                              message->extension_range_size());

    DescriptorProto::ExtensionRange* range = message->add_extension_range();
    location.RecordLegacyLocation(range,
                                  DescriptorPool::ErrorCollector::NUMBER);

    int start, end;
    io::Tokenizer::Token start_token;

    {
      LocationRecorder start_location(
          location, DescriptorProto::ExtensionRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, "Expected field number range."));

      if (start == std::numeric_limits<int>::max()) {
        RecordError("Field number out of bounds.");
        return false;
      }
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));

        if (end == std::numeric_limits<int>::max()) {
          RecordError("Field number out of bounds.");
          return false;
        }
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
  } while (TryConsume(","));

  if (LookingAt("[")) {
    int range_number_index = extensions_location.CurrentPathSize();
    SourceCodeInfo info;

    // Parse extension range options in the first range.
    ExtensionRangeOptions* options =
        message->mutable_extension_range(old_range_size)->mutable_options();

    {
      LocationRecorder index_location(
          extensions_location, 0 /* we fill this in w/ actual index below */,
          &info);
      LocationRecorder location(
          index_location, DescriptorProto::ExtensionRange::kOptionsFieldNumber);
      DO(Consume("["));

      do {
        DO(ParseOption(options, location, containing_file, OPTION_ASSIGNMENT));
      } while (TryConsume(","));

      DO(Consume("]"));
    }

    // Then copy the extension range options to all of the other ranges we've
    // parsed.
    for (int i = old_range_size + 1; i < message->extension_range_size(); i++) {
      *message->mutable_extension_range(i)->mutable_options() = *options;
    }
    // and copy source locations to the other ranges, too
    for (int i = old_range_size; i < message->extension_range_size(); i++) {
      for (int j = 0; j < info.location_size(); j++) {
        if (info.location(j).path_size() == range_number_index + 1) {
          // this location's path is up to the extension range index, but
          // doesn't include options; so it's redundant with location above
          continue;
        }
        SourceCodeInfo_Location* dest = source_code_info_->add_location();
        *dest = info.location(j);
        dest->set_path(range_number_index, i);
      }
    }
  }

  DO(ConsumeEndOfDeclaration(";", &extensions_location));
  return true;
}